

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::StartCall(ByteCodeWriter *this,OpCode op,ArgSlot ArgCount)

{
  OpLayoutStartCall op_00;
  ArgSlot local_1a;
  OpLayoutType local_18;
  ArgSlot local_14;
  OpLayoutStartCall data;
  ArgSlot ArgCount_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_14 = ArgCount;
  data.ArgCount = op;
  CheckOpen(this);
  op_00.ArgCount = data.ArgCount;
  OpLayoutType::OpLayoutType(&local_18,StartCall);
  CheckOp(this,op_00.ArgCount,local_18);
  local_1a = local_14;
  Data::Encode(&this->m_byteCodeData,data.ArgCount,&local_1a,2,this);
  return;
}

Assistant:

void ByteCodeWriter::StartCall(OpCode op, ArgSlot ArgCount)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::StartCall);

        OpLayoutStartCall data;
        data.ArgCount = ArgCount;
        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }